

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_seek(int handle,LONGLONG offset)

{
  int iVar1;
  __off64_t in_RSI;
  int in_EDI;
  int local_4;
  
  iVar1 = fseeko64((FILE *)handleTable[in_EDI].fileptr,in_RSI,0);
  if (iVar1 == 0) {
    handleTable[in_EDI].currentpos = in_RSI;
    local_4 = 0;
  }
  else {
    local_4 = 0x74;
  }
  return local_4;
}

Assistant:

int file_seek(int handle, LONGLONG offset)
/*
  seek to position relative to start of the file
*/
{

#if defined(_MSC_VER) && (_MSC_VER >= 1400)
    
     /* Microsoft visual studio C++ */
     /* _fseeki64 supported beginning with version 8.0 */
 
    if (_fseeki64(handleTable[handle].fileptr, (OFF_T) offset, 0) != 0)
        return(SEEK_ERROR);
	
#elif _FILE_OFFSET_BITS - 0 == 64

    if (fseeko(handleTable[handle].fileptr, (OFF_T) offset, 0) != 0)
        return(SEEK_ERROR);

#else

    if (fseek(handleTable[handle].fileptr, (OFF_T) offset, 0) != 0)
        return(SEEK_ERROR);

#endif

    handleTable[handle].currentpos = offset;
    return(0);
}